

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

str __thiscall
pybind11::str::format<pybind11::object&,pybind11::str>(str *this,object *args,str *args_1)

{
  object in_RDI;
  object_api<pybind11::handle> *in_stack_ffffffffffffffa8;
  str *in_stack_ffffffffffffffb8;
  object *in_stack_ffffffffffffffc0;
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>
  *in_stack_ffffffffffffffc8;
  str *in_stack_ffffffffffffffd0;
  
  pybind11::detail::object_api<pybind11::handle>::attr
            (in_stack_ffffffffffffffa8,&stack0xffffffffffffffb8);
  pybind11::detail::
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::operator()
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  str(in_stack_ffffffffffffffd0,(object *)in_stack_ffffffffffffffc8);
  object::~object((object *)0x3a0a16);
  pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
            ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x3a0a20);
  return (str)in_RDI.super_handle.m_ptr;
}

Assistant:

str format(Args &&...args) const {
        return attr("format")(std::forward<Args>(args)...);
    }